

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtt.c
# Opt level: O2

void vtt_free(vtt_t *vtt)

{
  vtt_block_t *pvVar1;
  
  pvVar1 = vtt->region_head;
  while (pvVar1 != (vtt_block_t *)0x0) {
    pvVar1 = vtt_block_free_head(pvVar1);
    vtt->region_head = pvVar1;
  }
  pvVar1 = vtt->style_head;
  while (pvVar1 != (vtt_block_t *)0x0) {
    pvVar1 = vtt_block_free_head(pvVar1);
    vtt->style_head = pvVar1;
  }
  pvVar1 = vtt->cue_head;
  while (pvVar1 != (vtt_block_t *)0x0) {
    pvVar1 = vtt_block_free_head(pvVar1);
    vtt->cue_head = pvVar1;
  }
  free(vtt);
  return;
}

Assistant:

void vtt_free(vtt_t* vtt)
{
    while (vtt->region_head != NULL) {
        vtt->region_head = vtt_block_free_head(vtt->region_head);
    }
    while (vtt->style_head != NULL) {
        vtt->style_head = vtt_block_free_head(vtt->style_head);
    }
    while (vtt->cue_head != NULL) {
        vtt->cue_head = vtt_block_free_head(vtt->cue_head);
    }
    free(vtt);
}